

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::buildNewFrame(CBuildVisitor *this,CMethod *declaration)

{
  element_type *peVar1;
  long lVar2;
  CArgumentList *pCVar3;
  pointer pcVar4;
  pointer pbVar5;
  int iVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  _Node *p_Var9;
  undefined8 uVar10;
  pointer pbVar11;
  pointer puVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  shared_ptr<const_ClassInfo> baseClass;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argumentsNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  localNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this->symbolTable,&this->currentClassName);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_0012c9bf:
    std::__throw_out_of_range("_Map_base::at");
  }
  else {
    peVar1 = *(element_type **)
              ((long)cVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                     ._M_cur + 0x28);
    local_f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)cVar7.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                       ._M_cur + 0x30);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_f0->_M_use_count = local_f0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_f0->_M_use_count = local_f0->_M_use_count + 1;
      }
    }
    cVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(peVar1->methods)._M_h,
                   &((declaration->name)._M_t.
                     super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                     super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                     super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      lVar2 = *(long *)((long)cVar8.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_true>
                              ._M_cur + 0x28);
      local_d8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)cVar8.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_true>
                         ._M_cur + 0x30);
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_d8->_M_use_count = local_d8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_d8->_M_use_count = local_d8->_M_use_count + 1;
        }
      }
      pCVar3 = (declaration->arguments)._M_t.
               super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
               super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
               super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
      argumentsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      argumentsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      argumentsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&argumentsNames,
                (long)*(pointer *)
                       ((long)&(pCVar3->arguments).
                               super__Vector_base<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
                       + 8) -
                *(long *)&(pCVar3->arguments).
                          super__Vector_base<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
                          ._M_impl >> 3);
      puVar12 = *(pointer *)
                 &(pCVar3->arguments).
                  super__Vector_base<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
                  ._M_impl;
      if (puVar12 !=
          *(pointer *)
           ((long)&(pCVar3->arguments).
                   super__Vector_base<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
           + 8)) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&argumentsNames,
                      (value_type *)
                      (*(long *)((long)(puVar12->_M_t).
                                       super___uniq_ptr_impl<CArgument,_std::default_delete<CArgument>_>
                                + 0x20) + 0x18));
          puVar12 = puVar12 + 1;
        } while (puVar12 !=
                 *(pointer *)
                  ((long)&(pCVar3->arguments).
                          super__Vector_base<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
                  + 8));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&localNames,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(*(long *)(lVar2 + 0x48) + 0x38));
      local_a0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a0;
      local_a0._M_impl._M_node._M_size = 0;
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_f0->_M_use_count = local_f0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_f0->_M_use_count = local_f0->_M_use_count + 1;
        }
      }
      baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_f0;
      local_a0._M_impl._M_node.super__List_node_base._M_prev =
           local_a0._M_impl._M_node.super__List_node_base._M_next;
      if (peVar1 != (element_type *)0x0) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&fields,&(((baseClass.
                               super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->fields).
                             super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            variableNames);
          pbVar5 = fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar11 = fields.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar5;
              pbVar11 = pbVar11 + 1) {
            pcVar4 = (pbVar11->_M_dataplus)._M_p;
            name._M_dataplus._M_p = (pointer)&name.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&name,pcVar4,pcVar4 + pbVar11->_M_string_length);
            p_Var9 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                     _M_create_node<std::__cxx11::string_const&>
                               ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                                &local_a0,&name);
            std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
            local_a0._M_impl._M_node._M_size = local_a0._M_impl._M_node._M_size + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p);
            }
          }
          iVar6 = std::__cxx11::string::compare
                            ((char *)&(baseClass.
                                       super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->baseClass);
          if (iVar6 == 0) {
            name._M_dataplus._M_p = (pointer)0x0;
            name._M_string_length = 0;
          }
          else {
            cVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)this->symbolTable,
                           &(baseClass.
                             super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->baseClass);
            if (cVar7.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
              goto LAB_0012c9bf;
            }
            name._M_dataplus._M_p =
                 *(pointer *)
                  ((long)cVar7.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                         ._M_cur + 0x28);
            name._M_string_length =
                 *(size_type *)
                  ((long)cVar7.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                         ._M_cur + 0x30);
            if (name._M_string_length != 0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(name._M_string_length + 8) = *(int *)(name._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(name._M_string_length + 8) = *(int *)(name._M_string_length + 8) + 1;
              }
            }
          }
          baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)name._M_dataplus._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length);
          if (name._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_string_length);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&fields);
        } while (baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 (element_type *)0x0);
      }
      buildNewFrame<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_List_iterator<std::__cxx11::string>>
                (this,&this->currentClassName,
                 &((declaration->name)._M_t.
                   super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                   super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                   super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )argumentsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )argumentsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )localNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )localNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_a0._M_impl._M_node.super__List_node_base._M_next,
                 (_List_node_base *)&local_a0);
      if (baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&localNames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&argumentsNames);
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
      }
      return;
    }
  }
  uVar10 = std::__throw_out_of_range("_Map_base::at");
  if (baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (baseClass.super___shared_ptr<const_ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&localNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argumentsNames);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

void CBuildVisitor::buildNewFrame( const CMethod *declaration ) {
    std::shared_ptr<const ClassInfo> classDefinition = symbolTable->classes.at( currentClassName );
    std::shared_ptr<const MethodInfo> methodDefinition = classDefinition->methods.at( declaration->name->name );

    const std::vector<std::unique_ptr<CArgument>> &arguments = declaration->arguments->arguments;
    std::vector<std::string> argumentsNames;
    argumentsNames.reserve( arguments.size( ));
    for ( auto it = arguments.begin( ); it != arguments.end( ); ++it ) {
        argumentsNames.push_back(( *it )->id->name );
    }
    auto localNames = methodDefinition->fields->variableNames;

    auto fieldsNames = std::list<std::string>( );
    std::shared_ptr<const ClassInfo> baseClass = classDefinition;
    while ( baseClass ) {
        auto fields = baseClass->fields->variableNames;
        for ( auto name : fields ) {
            fieldsNames.push_back( name );
        }
        baseClass = baseClass->baseClass != "" ? symbolTable->classes.at( baseClass->baseClass ) : nullptr;
    }

    buildNewFrame( currentClassName, declaration->name->name, argumentsNames.begin( ), argumentsNames.end( ),
                   localNames.begin( ), localNames.end( ), fieldsNames.begin( ), fieldsNames.end( ));
}